

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void parse(char *fileName,ValidationErrorHandler *errorHandler)

{
  Root root;
  Writer writer;
  Loader loader;
  allocator<char> local_4c9;
  Root local_4c8;
  String local_4b0;
  IWriter local_490;
  Loader local_488;
  
  COLLADASaxFWL::Loader::Loader(&local_488,&errorHandler->super_IErrorHandler);
  local_4c8.mWriter = &local_490;
  local_490._vptr_IWriter = (_func_int **)&PTR__IWriter_009537c0;
  local_4c8._vptr_Root = (_func_int **)&PTR__Root_00a04730;
  local_4c8.mLoader = &local_488.super_ILoader;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,fileName,&local_4c9);
  COLLADAFW::Root::loadDocument(&local_4c8,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  version = local_488.mCOLLADAVersion;
  COLLADAFW::Root::~Root(&local_4c8);
  COLLADASaxFWL::Loader::~Loader(&local_488);
  return;
}

Assistant:

void parse(char* fileName, ValidationErrorHandler& errorHandler)
{
	COLLADASaxFWL::Loader loader(&errorHandler);

	::Writer writer;

	COLLADAFW::Root root(&loader, &writer);

	root.loadDocument(fileName);
	version = loader.getCOLLADAVersion();
}